

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_distance_of_landscapes_on_grid.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  size_type sVar5;
  long lVar6;
  size_type sVar7;
  long lVar8;
  long lVar9;
  char **__args;
  long lVar10;
  double dVar11;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  distance;
  vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
  landscaspes;
  ofstream out;
  allocator_type local_299;
  char **local_298;
  iterator iStack_290;
  char **local_288;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_280;
  vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
  local_268;
  double local_250;
  long local_248;
  value_type_conflict local_240;
  undefined1 local_238 [8];
  pointer pdStack_230;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_228;
  size_t local_210;
  size_t local_208;
  ios_base local_140 [272];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "This program computes distance of persistence landscapes on grid stored in files (the files needs to "
             ,0x65);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"be created beforehand).\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The first parameter of a program is an integer p. The program compute L^p distance of the two heat "
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"maps. For L^infty distance choose p = -1. \n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The remaining parameters of this program are names of files with persistence landscapes on grid.\n"
             ,0x61);
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Wrong number of parameters, the program will now terminate \n"
               ,0x3c);
    iVar2 = 1;
  }
  else {
    iVar2 = atoi(argv[1]);
    if (iVar2 == -1) {
      local_250 = 1.79769313486232e+308;
    }
    else {
      local_250 = (double)iVar2;
    }
    local_298 = (char **)0x0;
    iStack_290._M_current = (char **)0x0;
    local_288 = (char **)0x0;
    __args = argv + 2;
    lVar4 = (ulong)(uint)argc - 2;
    do {
      if (iStack_290._M_current == local_288) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_298,iStack_290,__args);
      }
      else {
        *iStack_290._M_current = *__args;
        iStack_290._M_current = iStack_290._M_current + 1;
      }
      __args = __args + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    local_268.
    super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ::reserve(&local_268,(long)iStack_290._M_current - (long)local_298 >> 3);
    if (iStack_290._M_current == local_298) {
      sVar7 = 0;
    }
    else {
      sVar5 = 0;
      do {
        local_228.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_228.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_228.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_210 = 0;
        local_238 = (undefined1  [8])0x0;
        pdStack_230 = (pointer)0x0;
        local_208 = local_210;
        Gudhi::Persistence_representations::Persistence_landscape_on_grid::load_landscape_from_file
                  ((Persistence_landscape_on_grid *)local_238,local_298[sVar5]);
        std::
        vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
        ::push_back(&local_268,(Persistence_landscape_on_grid *)local_238);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_228);
        sVar5 = sVar5 + 1;
        sVar7 = (long)iStack_290._M_current - (long)local_298 >> 3;
      } while (sVar5 != sVar7);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_280,sVar7,(allocator_type *)local_238);
    if ((long)iStack_290._M_current - (long)local_298 != 0) {
      sVar5 = (long)iStack_290._M_current - (long)local_298 >> 3;
      lVar4 = 0;
      sVar7 = 0;
      do {
        local_240 = 0.0;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_238,sVar5,&local_240,&local_299)
        ;
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&((local_280.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar4),
                   (vector<double,_std::allocator<double>_> *)local_238);
        if (local_238 != (undefined1  [8])0x0) {
          operator_delete((void *)local_238,
                          (long)local_228.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)local_238);
        }
        sVar7 = sVar7 + 1;
        sVar5 = (long)iStack_290._M_current - (long)local_298 >> 3;
        lVar4 = lVar4 + 0x18;
      } while (sVar7 != sVar5);
    }
    if (local_268.
        super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_268.
        super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      lVar9 = 0;
      lVar10 = 0;
      do {
        lVar6 = lVar10;
        lVar8 = lVar9;
        local_248 = lVar4;
        if (lVar10 != ((long)local_268.
                             super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_268.
                             super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) {
          do {
            dVar11 = Gudhi::Persistence_representations::compute_distance_of_landscapes_on_grid
                               (local_268.
                                super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar10,
                                (Persistence_landscape_on_grid *)
                                ((long)&(local_268.
                                         super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->grid_min +
                                lVar8),local_250);
            *(double *)
             (*(long *)((long)&((local_280.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar4) + lVar10 * 8) = dVar11;
            local_280.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar10].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6] = dVar11;
            lVar6 = lVar6 + 1;
            lVar8 = lVar8 + 0x38;
            lVar4 = lVar4 + 0x18;
          } while (lVar6 != ((long)local_268.
                                   super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_268.
                                   super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7);
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x38;
        lVar4 = local_248 + 0x18;
      } while (lVar10 != ((long)local_268.
                                super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_268.
                                super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7
              );
    }
    std::ofstream::ofstream(local_238);
    std::ofstream::open(local_238,0x107481);
    if (local_280.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_280.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      do {
        if (local_280.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_280.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar9 = 0;
          do {
            poVar3 = std::ostream::_M_insert<double>
                               (local_280.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            poVar3 = std::ostream::_M_insert<double>
                               (local_280.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            lVar9 = lVar9 + 1;
          } while (lVar9 != ((long)local_280.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_280.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555);
        }
        std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        cVar1 = (char)local_238;
        std::ios::widen(SUB81(*(pointer)((long)local_238 + -0x18),0) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        lVar4 = lVar4 + 1;
      } while (lVar4 != ((long)local_280.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_280.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
              );
    }
    std::ofstream::close();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Distance can be found in \'distance.g_land\' file\n",0x30);
    local_238 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_238 + (long)_VTT[-3]) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&pdStack_230);
    std::ios_base::~ios_base(local_140);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_280);
    std::
    vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ::~vector(&local_268);
    if (local_298 != (char **)0x0) {
      operator_delete(local_298,(long)local_288 - (long)local_298);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes distance of persistence landscapes on grid stored in files (the files needs to "
            << "be created beforehand).\n"
            << "The first parameter of a program is an integer p. The program compute L^p distance of the two heat "
            << "maps. For L^infty distance choose p = -1. \n"
            << "The remaining parameters of this program are names of files with persistence landscapes on grid.\n";

  if (argc < 3) {
    std::clog << "Wrong number of parameters, the program will now terminate \n";
    return 1;
  }

  int pp = atoi(argv[1]);
  double p = std::numeric_limits<double>::max();
  if (pp != -1) {
    p = pp;
  }

  std::vector<const char*> filenames;
  for (int i = 2; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }
  std::vector<Persistence_landscape_on_grid> landscaspes;
  landscaspes.reserve(filenames.size());
  for (size_t file_no = 0; file_no != filenames.size(); ++file_no) {
    Persistence_landscape_on_grid l;
    l.load_landscape_from_file(filenames[file_no]);
    landscaspes.push_back(l);
  }

  // and now we will compute the scalar product of landscapes.

  // first we prepare an array:
  std::vector<std::vector<double> > distance(filenames.size());
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::vector<double> v(filenames.size(), 0);
    distance[i] = v;
  }

  // and now we can compute the scalar product:
  for (size_t i = 0; i != landscaspes.size(); ++i) {
    for (size_t j = i; j != landscaspes.size(); ++j) {
      distance[i][j] = distance[j][i] = compute_distance_of_landscapes_on_grid(landscaspes[i], landscaspes[j], p);
    }
  }

  // and now output the result to the screen and a file:
  std::ofstream out;
  out.open("distance.g_land");
  for (size_t i = 0; i != distance.size(); ++i) {
    for (size_t j = 0; j != distance.size(); ++j) {
      std::clog << distance[i][j] << " ";
      out << distance[i][j] << " ";
    }
    std::clog << std::endl;
    out << std::endl;
  }
  out.close();

  std::clog << "Distance can be found in 'distance.g_land' file\n";
  return 0;
}